

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

uint32_t __thiscall CLIParser::next_uint(CLIParser *this)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  ulong uVar3;
  runtime_error *this_00;
  allocator local_59;
  char *local_58 [2];
  char local_48 [16];
  char *local_38;
  
  if (this->argc == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Tried to parse uint, but nothing left in arguments");
    goto LAB_00117c0f;
  }
  std::__cxx11::string::string((string *)local_58,*this->argv,&local_59);
  __nptr = local_58[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  uVar3 = strtoul(__nptr,&local_38,10);
  if (local_38 == __nptr) {
    std::__throw_invalid_argument("stoul");
  }
  else {
    if (*piVar2 == 0) {
LAB_00117b8d:
      *piVar2 = iVar1;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stoul");
      goto LAB_00117b8d;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    if (uVar3 >> 0x20 == 0) {
      this->argc = this->argc + -1;
      this->argv = this->argv + 1;
      return (uint32_t)uVar3;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"next_uint() out of range");
LAB_00117c0f:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint32_t next_uint()
	{
		if (!argc)
		{
			THROW("Tried to parse uint, but nothing left in arguments");
		}

		uint64_t val = stoul(*argv);
		if (val > numeric_limits<uint32_t>::max())
		{
			THROW("next_uint() out of range");
		}

		argc--;
		argv++;

		return uint32_t(val);
	}